

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strequal.c
# Opt level: O3

int curl_strnequal(char *first,char *second,size_t max)

{
  uint uVar1;
  __int32_t **pp_Var2;
  char cVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  
  cVar3 = *first;
  if (cVar3 == '\0') {
    lVar4 = 0;
  }
  else {
    pcVar6 = first + 1;
    do {
      lVar5 = (long)*second;
      if ((lVar5 == 0) || (max == 0)) goto LAB_00497137;
      pp_Var2 = __ctype_toupper_loc();
      lVar4 = (long)cVar3;
      if ((*pp_Var2)[lVar4] != (*pp_Var2)[lVar5]) goto LAB_0049714e;
      max = max - 1;
      second = second + 1;
      cVar3 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while (cVar3 != '\0');
    cVar3 = '\0';
LAB_00497137:
    lVar4 = (long)cVar3;
  }
  if (max == 0) {
    uVar1 = 1;
  }
  else {
    lVar5 = (long)*second;
    pp_Var2 = __ctype_toupper_loc();
LAB_0049714e:
    uVar1 = (uint)((*pp_Var2)[lVar4] == (*pp_Var2)[lVar5]);
  }
  return uVar1;
}

Assistant:

int curl_strnequal(const char *first, const char *second, size_t max)
{
#if defined(HAVE_STRNCASECMP)
  return !strncasecmp(first, second, max);
#elif defined(HAVE_STRNCMPI)
  return !strncmpi(first, second, max);
#elif defined(HAVE_STRNICMP)
  return !strnicmp(first, second, max);
#else
  while(*first && *second && max) {
    if(toupper(*first) != toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if(0 == max)
    return 1; /* they are equal this far */

  return toupper(*first) == toupper(*second);
#endif
}